

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceGLImpl.cpp
# Opt level: O2

Uint64 __thiscall Diligent::FenceGLImpl::GetCompletedValue(FenceGLImpl *this)

{
  _Elt_pointer ppVar1;
  GLenum GVar2;
  value_type *val_fence;
  
  while (ppVar1 = (this->m_PendingFences).
                  super__Deque_base<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->m_PendingFences).
        super__Deque_base<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar1) {
    GVar2 = (*__glewClientWaitSync)((ppVar1->second).SyncHandle,0,0);
    if (GVar2 != 0x911a) break;
    FenceBase<Diligent::EngineGLImplTraits>::UpdateLastCompletedFenceValue
              (&this->super_FenceBase<Diligent::EngineGLImplTraits>,ppVar1->first);
    std::
    deque<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
    ::pop_front(&this->m_PendingFences);
  }
  return (this->super_FenceBase<Diligent::EngineGLImplTraits>).m_LastCompletedFenceValue.
         super___atomic_base<unsigned_long>._M_i;
}

Assistant:

Uint64 FenceGLImpl::GetCompletedValue()
{
    while (!m_PendingFences.empty())
    {
        auto& val_fence = m_PendingFences.front();

        auto res =
            glClientWaitSync(val_fence.second,
                             0, // Can be SYNC_FLUSH_COMMANDS_BIT
                             0  // Timeout in nanoseconds
            );
        if (res == GL_ALREADY_SIGNALED)
        {
            UpdateLastCompletedFenceValue(val_fence.first);
            m_PendingFences.pop_front();
        }
        else
        {
            break;
        }
    }

    return m_LastCompletedFenceValue.load();
}